

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdlogger.cpp
# Opt level: O1

void __thiscall CfdLogger_Destructor_Test::TestBody(CfdLogger_Destructor_Test *this)

{
  bool bVar1;
  CfdLogger logger;
  AssertHelper local_50;
  long *local_48 [2];
  void *local_38;
  void *pvStack_30;
  long *local_28 [2];
  void *local_18;
  void *pvStack_10;
  
  cfd::core::logger::CfdLogger::CfdLogger((CfdLogger *)local_28);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::logger::CfdLogger::CfdLogger((CfdLogger *)local_48);
      local_18 = local_38;
      pvStack_10 = pvStack_30;
      local_28[0] = local_48[0];
      local_28[1] = local_48[1];
      cfd::core::logger::CfdLogger::~CfdLogger((CfdLogger *)local_48);
    }
  }
  else {
    testing::Message::Message((Message *)local_48);
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_cfdlogger.cpp"
               ,0x28,
               "Expected: (logger = CfdLogger()) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_50,(Message *)local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48[0] !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48[0] !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*local_48[0] + 8))();
      }
      local_48[0] = (long *)0x0;
    }
  }
  cfd::core::logger::CfdLogger::~CfdLogger((CfdLogger *)local_28);
  return;
}

Assistant:

TEST(CfdLogger, Destructor) {
  CfdLogger logger;
  EXPECT_NO_THROW((logger = CfdLogger()));
}